

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyTrimEmptyElement(TidyDocImpl *doc,Node *element)

{
  uint uVar1;
  TidyTagId TVar2;
  Dict *pDVar3;
  Bool BVar4;
  Node *pNVar5;
  AttVal *pAVar6;
  
  if (*(int *)((doc->config).value + 0xf) == 0) goto LAB_0013ee5e;
  BVar4 = prvTidynodeIsText(element);
  if (BVar4 != no) goto LAB_0013ee23;
  if (((element->content != (Node *)0x0) || (pDVar3 = element->tag, pDVar3 == (Dict *)0x0)) ||
     ((uVar1 = pDVar3->model, (uVar1 & 8) != 0 && (element->attributes != (AttVal *)0x0))))
  goto LAB_0013ee5e;
  if (element == (Node *)0x0) {
LAB_0013eeb5:
    if ((uVar1 & 0x201) != 0) goto LAB_0013ee5e;
  }
  else {
    if (pDVar3->id != TidyTag_P) {
      if ((pDVar3->id == TidyTag_A) && (element->attributes != (AttVal *)0x0)) goto LAB_0013ee5e;
      goto LAB_0013eeb5;
    }
    if (((uVar1 & 0x201) != 0) || (*(int *)((doc->config).value + 0x10) == 0)) goto LAB_0013ee5e;
  }
  if (element != (Node *)0x0) {
    TVar2 = pDVar3->id;
    if (((TVar2 == TidyTag_APPLET) || (TVar2 == TidyTag_OBJECT)) ||
       ((TVar2 == TidyTag_SCRIPT &&
        (pAVar6 = prvTidyAttrGetById(element,TidyAttr_SRC), pAVar6 != (AttVal *)0x0))))
    goto LAB_0013ee5e;
    if (element->tag != (Dict *)0x0) {
      TVar2 = element->tag->id;
      uVar1 = TVar2 - TidyTag_TEXTAREA;
      if (((uVar1 < 0x23) && ((0x400020011U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
         (TVar2 == TidyTag_IFRAME)) goto LAB_0013ee5e;
    }
  }
  pAVar6 = prvTidyAttrGetById(element,TidyAttr_ID);
  if (((pAVar6 == (AttVal *)0x0) &&
      (pAVar6 = prvTidyAttrGetById(element,TidyAttr_NAME), pAVar6 == (AttVal *)0x0)) &&
     (pAVar6 = prvTidyAttrGetById(element,TidyAttr_DATAFLD), pAVar6 == (AttVal *)0x0)) {
    TVar2 = element->tag->id;
    if (((TVar2 != TidyTag_UNKNOWN) && (element == (Node *)0x0 || TVar2 != TidyTag_BODY)) &&
       ((element == (Node *)0x0 ||
        (((TVar2 != TidyTag_COLGROUP && (TVar2 != TidyTag_DD)) &&
         ((TVar2 != TidyTag_OPTION || (element->attributes == (AttVal *)0x0)))))))) {
LAB_0013ee23:
      if (element->type != TextNode) {
        *(byte *)&doc->footnotes = (byte)doc->footnotes | 1;
        prvTidyReport(doc,element,(Node *)0x0,0x281);
      }
      pNVar5 = prvTidyDiscardElement(doc,element);
      return pNVar5;
    }
  }
LAB_0013ee5e:
  return element->next;
}

Assistant:

Node *TY_(TrimEmptyElement)( TidyDocImpl* doc, Node *element )
{
    if ( CanPrune(doc, element) )
    {
        if (element->type != TextNode)
        {
            doc->footnotes |= FN_TRIM_EMPTY_ELEMENT;
            TY_(Report)(doc, element, NULL, TRIM_EMPTY_ELEMENT);
        }

        return TY_(DiscardElement)(doc, element);
    }
    return element->next;
}